

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::(anonymous_namespace)::generateToVec4Expression_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Attribute *attrib,int id)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  ostream *poVar4;
  undefined4 in_register_0000000c;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  string variableName;
  ostringstream src;
  long *local_230;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  undefined8 local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar1 = *(int *)(this + 0x78);
  if (iVar1 == -1) {
    local_210 = &local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"","",CONCAT44(in_register_0000000c,id));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,(int)attrib);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x66a921);
    local_1e8 = &local_1d8;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_1d8 = *plVar5;
      lStack_1d0 = plVar3[3];
    }
    else {
      local_1d8 = *plVar5;
      local_1e8 = (long *)*plVar3;
    }
    local_1e0 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_210 = &local_200;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_200 = *plVar5;
      lStack_1f8 = plVar3[3];
    }
    else {
      local_200 = *plVar5;
      local_210 = (long *)*plVar3;
    }
    local_208 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_210,0,(char *)0x0,*(ulong *)(this + 0x28));
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_220 = *plVar5;
    lStack_218 = plVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar5;
    local_230 = (long *)*plVar3;
  }
  lVar6 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (iVar1 != -1) {
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_210 = &local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,*(long *)this,*(long *)(this + 8) + *(long *)this);
  uVar2 = *(undefined8 *)(this + 0x20);
  local_1f0._4_4_ = (int)((ulong)uVar2 >> 0x20);
  iVar1 = local_1f0._4_4_;
  local_1f0 = uVar2;
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  switch(iVar1) {
  case 0x8b51:
  case 0x8b54:
switchD_004daffd_caseD_8b51:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec4(",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_230,lVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".xyz, ",6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_230,lVar6);
    lVar6 = 3;
    pcVar7 = ".x)";
    break;
  case 0x8b52:
switchD_004daffd_caseD_8b52:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec4(",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_230,lVar6);
    lVar6 = 1;
    pcVar7 = ")";
    break;
  default:
    if (iVar1 != 0x8dc6) {
      if (iVar1 != 0x8dc7) goto switchD_004daffd_caseD_8b52;
      goto switchD_004daffd_caseD_8b51;
    }
  case 0x8b50:
  case 0x8b53:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec4(",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_230,lVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".xy, ",5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_230,lVar6);
    lVar6 = 4;
    pcVar7 = ".yx)";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string generateToVec4Expression (const Attribute& attrib, int id=-1)
{
	const string		variableName(attrib.getName() + (attrib.getArraySize() != Attribute::NOT_ARRAY ? "[" + de::toString(id) + "]" : ""));
	std::ostringstream	src;

	switch (attrib.getType().getGLTypeEnum())
	{
		case GL_INT_VEC2:
		case GL_UNSIGNED_INT_VEC2:
		case GL_FLOAT_VEC2:
			src << "vec4(" << variableName << ".xy, " << variableName << ".yx)";
			break;

		case GL_INT_VEC3:
		case GL_UNSIGNED_INT_VEC3:
		case GL_FLOAT_VEC3:
			src << "vec4(" << variableName << ".xyz, " << variableName << ".x)";
			break;

		default:
			src << "vec4(" << variableName << ")";
			break;
	}

	return src.str();
}